

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O0

void __thiscall
moira::Moira::dasmAddqEa<(moira::Instr)7,(moira::Mode)6,(moira::Size)2>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  StrWriter *pSVar1;
  ushort in_CX;
  StrWriter *in_RSI;
  StrWriter *in_RDI;
  Ea<(moira::Mode)6,_(moira::Size)2> dst;
  Imd src;
  Imd im;
  u32 *in_stack_ffffffffffffffd0;
  u16 in_stack_ffffffffffffffde;
  Imd in_stack_ffffffffffffffe0;
  undefined2 in_stack_ffffffffffffffe4;
  
  Imd::Imd((Imd *)&stack0xffffffffffffffe0,(int)(uint)in_CX >> 9 & 7);
  Op<(moira::Mode)6,(moira::Size)2>
            ((Moira *)CONCAT26(in_CX,CONCAT24(in_stack_ffffffffffffffe4,
                                              in_stack_ffffffffffffffe0.raw)),
             in_stack_ffffffffffffffde,in_stack_ffffffffffffffd0);
  if (in_stack_ffffffffffffffe0.raw == 0) {
    in_stack_ffffffffffffffe0.raw = 8;
  }
  pSVar1 = StrWriter::operator<<(in_RSI);
  pSVar1 = StrWriter::operator<<(pSVar1);
  im.raw = *(u32 *)(in_RDI->comment + 0x14);
  StrWriter::operator<<(pSVar1,(Align)im.raw);
  pSVar1 = StrWriter::operator<<(in_RDI,im);
  StrWriter::operator<<(pSVar1,", ");
  StrWriter::operator<<
            ((StrWriter *)CONCAT44(im.raw,in_stack_ffffffffffffffe0.raw),
             (Ea<(moira::Mode)6,_(moira::Size)2> *)in_RDI);
  return;
}

Assistant:

void
Moira::dasmAddqEa(StrWriter &str, u32 &addr, u16 op)
{
    auto src = Imd      ( ____xxx_________(op)       );
    auto dst = Op <M,S> ( _____________xxx(op), addr );

    if (src.raw == 0) src.raw = 8;
    str << Ins<I>{} << Sz<S>{} << tab << src << ", " << dst;
}